

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_fsincos_m68k(CPUM68KState_conflict *env,FPReg_conflict *res0,FPReg_conflict *res1,
                        FPReg_conflict *val)

{
  undefined1 auVar1 [12];
  floatx80 a;
  floatx80 fVar2;
  
  auVar1 = *(undefined1 (*) [12])val;
  fVar2._12_4_ = 0;
  fVar2._0_12_ = *(undefined1 (*) [12])val;
  fVar2 = floatx80_cos_m68k(fVar2,&env->fp_status);
  (res1->d).low = fVar2.low;
  (res1->d).high = fVar2.high;
  a._12_4_ = 0;
  a._0_12_ = auVar1;
  fVar2 = floatx80_sin_m68k(a,&env->fp_status);
  (res0->d).low = fVar2.low;
  (res0->d).high = fVar2.high;
  return;
}

Assistant:

void HELPER(fsincos)(CPUM68KState *env, FPReg *res0, FPReg *res1, FPReg *val)
{
    floatx80 a = val->d;
    /*
     * If res0 and res1 specify the same floating-point data register,
     * the sine result is stored in the register, and the cosine
     * result is discarded.
     */
    res1->d = floatx80_cos(a, &env->fp_status);
    res0->d = floatx80_sin(a, &env->fp_status);
}